

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O3

void Js::JavascriptArray::CopyHeadIfInlinedHeadSegment<int>
               (JavascriptArray *array,Recycler *recycler)

{
  Type *addr;
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  SparseArraySegmentBase *pSVar4;
  
  bVar2 = IsInlineSegment((array->head).ptr,array);
  if (!bVar2) {
    return;
  }
  addr = &array->head;
  pSVar4 = addr->ptr;
  if (pSVar4 == (SparseArraySegmentBase *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                ,0x1583,"(array->head)","array->head");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
    pSVar4 = addr->ptr;
  }
  pSVar4 = &ReallocNonLeafSegment<int>
                      (array,(SparseArraySegment<int> *)pSVar4,(pSVar4->next).ptr,false)->
            super_SparseArraySegmentBase;
  Memory::Recycler::WBSetBit((char *)addr);
  (array->head).ptr = pSVar4;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
  SetLastUsedSegment(array,(array->head).ptr);
  ClearSegmentMap(array);
  return;
}

Assistant:

void JavascriptArray::CopyHeadIfInlinedHeadSegment(JavascriptArray *array, Recycler *recycler)
    {
        if (JavascriptArray::IsInlineSegment(array->head, array))
        {
            AnalysisAssert(array->head);
            SparseArraySegment<T>* newHeadSeg = array->ReallocNonLeafSegment((SparseArraySegment<T>*)PointerValue(array->head), array->head->next);
            array->head = newHeadSeg;
            array->InvalidateLastUsedSegment();
            array->ClearSegmentMap();
        }
    }